

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq.c
# Opt level: O2

void * coll_seq_insert_before(coll_seq_t *seq,void *data,void *pos)

{
  coll_seq_node_t *pcVar1;
  coll_seq_t *pcVar2;
  coll_seq_node_t *pcVar3;
  coll_seq_node_t *pcVar4;
  
  if (seq != (coll_seq_t *)0x0) {
    pcVar2 = seq;
    pcVar4 = (coll_seq_node_t *)0x0;
    while (pcVar1 = pcVar2->head, pcVar1 != (coll_seq_node_t *)0x0) {
      if (pcVar1->data == pos) {
        pcVar3 = (coll_seq_node_t *)malloc(0x10);
        pcVar3->data = data;
        pcVar3->next = pcVar1;
        pcVar2 = (coll_seq_t *)&pcVar4->next;
        if (pcVar4 == (coll_seq_node_t *)0x0) {
          pcVar2 = seq;
        }
        pcVar2->head = pcVar3;
        seq->len = seq->len + 1;
        return data;
      }
      pcVar4 = pcVar1;
      pcVar2 = (coll_seq_t *)&pcVar1->next;
    }
  }
  return (void *)0x0;
}

Assistant:

void *coll_seq_insert_before(coll_seq_t *seq, void *data, void *pos) {
    if (!seq) {
        return NULL;
    }
    node_t *prev = NULL, *cur = seq->head;
    while (cur) {
        if (cur->data == pos) {
            node_t *node = malloc(sizeof(node_t));
            node->data = data;
            node->next = cur;
            if (prev) {
                prev->next = node;
            } else {
                seq->head = node;
            }
            ++(seq->len);
            return data;
        }
        prev = cur;
        cur = cur->next;
    }
    return NULL;
}